

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void __thiscall
DMessageBoxMenu::Init
          (DMessageBoxMenu *this,DMenu *parent,char *message,int messagemode,bool playsound)

{
  FBrokenLines *pFVar1;
  float volume;
  FSoundID local_2c;
  byte local_25;
  int local_24;
  bool playsound_local;
  char *pcStack_20;
  int messagemode_local;
  char *message_local;
  DMenu *parent_local;
  DMessageBoxMenu *this_local;
  
  local_25 = playsound;
  local_24 = messagemode;
  pcStack_20 = message;
  message_local = (char *)parent;
  parent_local = &this->super_DMenu;
  TObjPtr<DMenu>::operator=(&(this->super_DMenu).mParentMenu,parent);
  if (pcStack_20 == (char *)0x0) {
    this->mMessage = (FBrokenLines *)0x0;
  }
  else {
    if (*pcStack_20 == '$') {
      pcStack_20 = FStringTable::operator()(&GStrings,pcStack_20 + 1);
    }
    pFVar1 = V_BreakLines(SmallFont,300,pcStack_20,false);
    this->mMessage = pFVar1;
  }
  this->mMessageMode = local_24;
  if ((local_25 & 1) != 0) {
    S_StopSound(2);
    FSoundID::FSoundID(&local_2c,"menu/prompt");
    volume = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
    S_Sound(0x22,&local_2c,volume,0.0);
  }
  return;
}

Assistant:

void DMessageBoxMenu::Init(DMenu *parent, const char *message, int messagemode, bool playsound)
{
	mParentMenu = parent;
	if (message != NULL) 
	{
		if (*message == '$') message = GStrings(message+1);
		mMessage = V_BreakLines(SmallFont, 300, message);
	}
	else mMessage = NULL;
	mMessageMode = messagemode;
	if (playsound)
	{
		S_StopSound (CHAN_VOICE);
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/prompt", snd_menuvolume, ATTN_NONE);
	}
}